

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

string * str_first_non_empty(string *__return_storage_ptr__,
                            initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *l)

{
  iterator pbVar1;
  long lVar2;
  long lVar3;
  
  if (l->_M_len != 0) {
    pbVar1 = l->_M_array;
    lVar3 = 0;
    do {
      lVar2 = *(long *)((long)&pbVar1->_M_string_length + lVar3);
      if (lVar2 != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        lVar3 = *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,lVar3,lVar2 + lVar3);
        return __return_storage_ptr__;
      }
      lVar3 = lVar3 + 0x20;
    } while (l->_M_len << 5 != lVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string str_first_non_empty (const std::initializer_list<const std::string>& l)
{
    for (const std::string& s: l)
        if (!s.empty())
            return s;
    return "";
}